

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpplocate.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::obtainStringFromLibLocate_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *path,uint length)

{
  if (this == (_anonymous_namespace_ *)0x0 || (int)path == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this,this + ((ulong)path & 0xffffffff));
    free(this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string obtainStringFromLibLocate(char * path, unsigned int length)
{
    if (path == nullptr || length == 0)
    {
        return std::string();
    }

    auto result = std::string(path, length);

    // liblocate transfer ownership of pointer behind path variable
    free(path);

    return result;
}